

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SafetyCheckOk(sqlite3 *db)

{
  int iVar1;
  long in_RDI;
  u8 eOpenState;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    logBadConnection((char *)0x1452d2);
    local_4 = 0;
  }
  else if (*(char *)(in_RDI + 0x71) == 'v') {
    local_4 = 1;
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk
                      ((sqlite3 *)CONCAT17(*(char *)(in_RDI + 0x71),in_stack_ffffffffffffffe8));
    if (iVar1 != 0) {
      logBadConnection((char *)0x14530d);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckOk(sqlite3 *db){
  u8 eOpenState;
  if( db==0 ){
    logBadConnection("NULL");
    return 0;
  }
  eOpenState = db->eOpenState;
  if( eOpenState!=SQLITE_STATE_OPEN ){
    if( sqlite3SafetyCheckSickOrOk(db) ){
      testcase( sqlite3GlobalConfig.xLog!=0 );
      logBadConnection("unopened");
    }
    return 0;
  }else{
    return 1;
  }
}